

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_read.c
# Opt level: O3

int TIFFCheckRead(TIFF *tif,int tiles)

{
  char *fmt;
  char *module;
  
  if (tif->tif_mode == 1) {
    module = tif->tif_name;
    fmt = "File not open for reading";
  }
  else {
    if ((tif->tif_flags >> 10 & 1) == tiles) {
      return 1;
    }
    module = tif->tif_name;
    fmt = "Can not read tiles from a striped image";
    if (tiles == 0) {
      fmt = "Can not read scanlines from a tiled image";
    }
  }
  TIFFErrorExtR(tif,module,fmt);
  return 0;
}

Assistant:

static int TIFFCheckRead(TIFF *tif, int tiles)
{
    if (tif->tif_mode == O_WRONLY)
    {
        TIFFErrorExtR(tif, tif->tif_name, "File not open for reading");
        return (0);
    }
    if (tiles ^ isTiled(tif))
    {
        TIFFErrorExtR(tif, tif->tif_name,
                      tiles ? "Can not read tiles from a striped image"
                            : "Can not read scanlines from a tiled image");
        return (0);
    }
    return (1);
}